

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-timed.c
# Opt level: O0

_Bool mon_set_timed(monster *mon,wchar_t effect_type,wchar_t timer,wchar_t flag)

{
  short sVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  _Bool _Var5;
  wchar_t wVar6;
  wchar_t local_38;
  wchar_t old_timer;
  wchar_t m_note;
  _Bool update;
  _Bool resisted;
  _Bool check_resist;
  mon_timed_effect *effect;
  wchar_t local_20;
  wchar_t flag_local;
  wchar_t timer_local;
  wchar_t effect_type_local;
  monster *mon_local;
  
  if (mon == (monster *)0x0) {
    __assert_fail("mon != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-timed.c"
                  ,0x8a,"_Bool mon_set_timed(struct monster *, int, int, int)");
  }
  if (mon->race == (monster_race *)0x0) {
    __assert_fail("mon->race != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-timed.c"
                  ,0x8b,"_Bool mon_set_timed(struct monster *, int, int, int)");
  }
  if (effect_type < L'\0') {
    __assert_fail("effect_type >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-timed.c"
                  ,0x8c,"_Bool mon_set_timed(struct monster *, int, int, int)");
  }
  if (L'\t' < effect_type) {
    __assert_fail("effect_type < MON_TMD_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-timed.c"
                  ,0x8d,"_Bool mon_set_timed(struct monster *, int, int, int)");
  }
  if (timer < L'\0') {
    __assert_fail("timer >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-timed.c"
                  ,0x8e,"_Bool mon_set_timed(struct monster *, int, int, int)");
  }
  bVar3 = 0;
  bVar4 = false;
  local_38 = L'\0';
  sVar1 = mon->m_timed[effect_type];
  wVar6 = (wchar_t)sVar1;
  local_20 = timer;
  if (effects[effect_type].max_timer < timer) {
    local_20 = effects[effect_type].max_timer;
  }
  if (wVar6 == local_20) {
    mon_local._7_1_ = false;
  }
  else {
    if (local_20 == L'\0') {
      local_38 = effects[effect_type].message_end;
      effect._4_4_ = flag | 1;
      bVar2 = false;
      if (effect_type == L'\b') {
        (mon->target).midx = L'\0';
      }
    }
    else if (wVar6 == L'\0') {
      local_38 = effects[effect_type].message_begin;
      effect._4_4_ = flag | 1;
      bVar2 = true;
    }
    else {
      bVar2 = wVar6 < local_20;
      effect._4_4_ = flag;
      if (bVar2) {
        local_38 = effects[effect_type].message_increase;
      }
    }
    if ((bVar2) && (_Var5 = does_resist(mon,effect_type,local_20,effect._4_4_), _Var5)) {
      bVar3 = 1;
      local_38 = L'\b';
    }
    else {
      mon->m_timed[effect_type] = (int16_t)local_20;
      bVar4 = true;
    }
    if (effect_type == L'\t') {
      if (wVar6 < local_20) {
        _Var5 = monster_change_shape(mon);
        if (!_Var5) {
          local_38 = L'+';
          mon->m_timed[9] = sVar1;
        }
      }
      else if ((local_20 == L'\0') && (_Var5 = monster_revert_shape(mon), !_Var5)) {
        quit("Monster shapechange reversion failed!");
      }
    }
    if ((((local_38 != L'\0') && ((effect._4_4_ & 4U) == 0)) && ((effect._4_4_ & 1U) != 0)) &&
       (_Var5 = monster_is_obvious(mon), _Var5)) {
      add_monster_message(mon,local_38,true);
    }
    if (bVar4) {
      if (player->upkeep->health_who == mon) {
        player->upkeep->redraw = player->upkeep->redraw | 0x200;
      }
      player->upkeep->redraw = player->upkeep->redraw | 0x400000;
    }
    mon_local._7_1_ = (_Bool)(bVar3 ^ 1);
  }
  return mon_local._7_1_;
}

Assistant:

static bool mon_set_timed(struct monster *mon,
		int effect_type,
		int timer,
		int flag)
{
	assert(mon != NULL);
	assert(mon->race != NULL);
	assert(effect_type >= 0);
	assert(effect_type < MON_TMD_MAX);
	assert(timer >= 0);

	struct mon_timed_effect *effect = &effects[effect_type];

	bool check_resist;
	bool resisted = false;
	bool update = false;

	int m_note = 0;
	int old_timer = mon->m_timed[effect_type];

	/* Limit time of effect */
	if (timer > effect->max_timer) {
		timer = effect->max_timer;
	}

	/* No change */
	if (old_timer == timer) {
		return false;
	} else if (timer == 0) {
		/* Turning off, usually mention */
		m_note = effect->message_end;
		flag |= MON_TMD_FLG_NOTIFY;
		check_resist = false;

		/* When monster command by player (Necromancer power) expires,
		* don't leave stale monster -> monster target */
		if (effect_type == MON_TMD_COMMAND) {
			mon->target.midx = 0;
		}
	} else if (old_timer == 0) {
		/* Turning on, usually mention */
		m_note = effect->message_begin;
		flag |= MON_TMD_FLG_NOTIFY;
		check_resist = true;
	} else if (timer > old_timer) {
		/* Different message for increases, but don't automatically mention. */
		m_note = effect->message_increase;
		check_resist = true;
	} else {
		/* Decreases don't get a message, but never resist them */
		check_resist = false;
	}

	/* Determine if the monster resisted or not, if appropriate */
	if (check_resist && does_resist(mon, effect_type, timer, flag)) {
		resisted = true;
		m_note = MON_MSG_UNAFFECTED;
	} else {
		mon->m_timed[effect_type] = timer;
		update = true;
	}

	/* Special case - deal with monster shapechanges */
	if (effect_type == MON_TMD_CHANGED) {
		if (timer > old_timer) {
			if (!monster_change_shape(mon)) {
				m_note = MON_MSG_SHAPE_FAIL;
				mon->m_timed[effect_type] = old_timer;
			}
		} else if (timer == 0) {
			if (!monster_revert_shape(mon)) {
				quit ("Monster shapechange reversion failed!");
			}
		}
	}

	/* Print a message if there is one, if the effect allows for it, and if
	 * either the monster is visible, or we're trying to ID something */
	if (m_note &&
		!(flag & MON_TMD_FLG_NOMESSAGE) &&
		(flag & MON_TMD_FLG_NOTIFY)
		&& monster_is_obvious(mon)) {
			add_monster_message(mon, m_note, true);
	}

	/* Update the visuals, as appropriate. */
	if (update) {
		if (player->upkeep->health_who == mon)
			player->upkeep->redraw |= (PR_HEALTH);

		player->upkeep->redraw |= (PR_MONLIST);
	}

	return !resisted;
}